

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

void Imath_3_2::maxEigenVector<Imath_3_2::Matrix33<float>,Imath_3_2::Vec3<float>>
               (Matrix33<float> *A,Vec3<float> *V)

{
  int iVar1;
  uint i;
  long lVar2;
  float *pfVar3;
  int iVar4;
  Vec3<float> S;
  Vec3<float> local_44;
  Matrix33<float> local_38;
  
  local_38.x[0][0] = 1.0;
  local_38.x[0][1] = 0.0;
  local_38.x[0][2] = 0.0;
  local_38.x[1][0] = 0.0;
  local_38.x[1][1] = 1.0;
  local_38.x[1][2] = 0.0;
  local_38.x[2][0] = 0.0;
  local_38.x[2][1] = 0.0;
  local_38.x[2][2] = 1.0;
  jacobiEigenSolver<float>(A,&local_44,&local_38,1.1920929e-07);
  iVar4 = 0;
  lVar2 = 1;
  do {
    iVar1 = (int)lVar2;
    if (ABS((&local_44.x)[lVar2]) <= ABS((&local_44.x)[iVar4])) {
      iVar1 = iVar4;
    }
    iVar4 = iVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  pfVar3 = local_38.x[0] + iVar4;
  lVar2 = 0;
  do {
    (&V->x)[lVar2] = *pfVar3;
    lVar2 = lVar2 + 1;
    pfVar3 = pfVar3 + 3;
  } while (lVar2 != 3);
  return;
}

Assistant:

void
maxEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver (A, S, MV);

    int maxIdx (0);
    for (unsigned int i = 1; i < TV::dimensions (); ++i)
    {
        if (std::abs (S[i]) > std::abs (S[maxIdx])) maxIdx = i;
    }

    for (unsigned int i = 0; i < TV::dimensions (); ++i)
        V[i] = MV[i][maxIdx];
}